

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O1

void __thiscall QCalendarWidgetPrivate::updateMonthMenu(QCalendarWidgetPrivate *this)

{
  int iVar1;
  QCalendarModel *pQVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  QAction **ppQVar6;
  long in_FS_OFFSET;
  bool bVar7;
  bool enable;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = QCalendar::monthsInYear((int)this->m_model + 0x18);
  pQVar2 = this->m_model;
  uVar3 = *(undefined8 *)&pQVar2->m_calendar;
  iVar1 = pQVar2->m_shownYear;
  iVar5 = QDate::year(&pQVar2->m_minimumDate,uVar3);
  bVar7 = true;
  if (iVar1 == iVar5) {
    QDate::month(&this->m_model->m_minimumDate,uVar3);
    iVar1 = this->m_model->m_shownMonth;
    iVar5 = QDate::month(&this->m_model->m_minimumDate,uVar3);
    bVar7 = iVar1 != iVar5;
  }
  iVar1 = this->m_model->m_shownYear;
  iVar5 = QDate::year(&this->m_model->m_maximumDate,uVar3);
  enable = true;
  if (iVar1 == iVar5) {
    QDate::month(&this->m_model->m_maximumDate,uVar3);
    iVar1 = this->m_model->m_shownMonth;
    iVar5 = QDate::month(&this->m_model->m_maximumDate,uVar3);
    enable = iVar1 != iVar5;
  }
  QWidget::setEnabled((QWidget *)this->prevMonth,bVar7);
  QWidget::setEnabled((QWidget *)this->nextMonth,enable);
  local_3c = 1;
  if (0 < iVar4) {
    do {
      ppQVar6 = QMap<int,_QAction_*>::operator[](&this->monthToAction,&local_3c);
      QAction::setEnabled(SUB81(*ppQVar6,0));
      iVar1 = local_3c + 1;
      bVar7 = local_3c < iVar4;
      local_3c = iVar1;
    } while (bVar7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarWidgetPrivate::updateMonthMenu()
{
    int maxMonths = m_model->m_calendar.monthsInYear(m_model->m_shownYear);
    int beg = 1, end = maxMonths;
    bool prevEnabled = true;
    bool nextEnabled = true;
    QCalendar cal = m_model->calendar();
    if (m_model->m_shownYear == m_model->m_minimumDate.year(cal)) {
        beg = m_model->m_minimumDate.month(cal);
        if (m_model->m_shownMonth == m_model->m_minimumDate.month(cal))
            prevEnabled = false;
    }
    if (m_model->m_shownYear == m_model->m_maximumDate.year(cal)) {
        end = m_model->m_maximumDate.month(cal);
        if (m_model->m_shownMonth == m_model->m_maximumDate.month(cal))
            nextEnabled = false;
    }
    prevMonth->setEnabled(prevEnabled);
    nextMonth->setEnabled(nextEnabled);
    for (int i = 1; i <= maxMonths; i++) {
        bool monthEnabled = true;
        if (i < beg || i > end)
            monthEnabled = false;
        monthToAction[i]->setEnabled(monthEnabled);
    }
}